

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physical_piecewise_merge_join.cpp
# Opt level: O3

SourceResultType __thiscall
duckdb::PhysicalPiecewiseMergeJoin::GetData
          (PhysicalPiecewiseMergeJoin *this,ExecutionContext *context,DataChunk *result,
          OperatorSourceInput *input)

{
  default_delete<duckdb::PayloadScanner> *this_00;
  GlobalSourceState *pGVar1;
  _Head_base<0UL,_bool_*,_false> _Var2;
  pointer pIVar3;
  pointer pLVar4;
  pointer pLVar5;
  PayloadScanner *__ptr;
  int iVar6;
  pointer pGVar7;
  pointer pGVar8;
  Allocator *allocator;
  pointer this_01;
  const_reference pvVar9;
  reference pvVar10;
  reference other;
  reference this_02;
  pointer pSVar11;
  type sorted_data;
  PayloadScanner *this_03;
  size_type sVar12;
  idx_t iVar13;
  vector<std::reference_wrapper<duckdb::PhysicalOperator>,_true> *this_04;
  long lVar14;
  idx_t count;
  long lVar15;
  bool bVar16;
  SelectionVector rsel;
  DataChunk rhs_chunk;
  SelectionVector local_88;
  DataChunk local_70;
  
  pGVar7 = unique_ptr<duckdb::GlobalSinkState,_std::default_delete<duckdb::GlobalSinkState>,_true>::
           operator->(&(this->super_PhysicalRangeJoin).super_PhysicalComparisonJoin.
                       super_PhysicalJoin.super_CachingPhysicalOperator.super_PhysicalOperator.
                       sink_state);
  pGVar1 = input->global_state;
  iVar6 = pthread_mutex_lock((pthread_mutex_t *)(pGVar1 + 1));
  if (iVar6 != 0) {
    ::std::__throw_system_error(iVar6);
  }
  this_00 = (default_delete<duckdb::PayloadScanner> *)
            &pGVar1[1].super_StateWithBlockableTasks.lock.super___mutex_base._M_mutex.__data.__list.
             __next;
  if (pGVar1[1].super_StateWithBlockableTasks.lock.super___mutex_base._M_mutex.__data.__list.__next
      == (__pthread_internal_list *)0x0) {
    pGVar8 = unique_ptr<duckdb::PhysicalRangeJoin::GlobalSortedTable,_std::default_delete<duckdb::PhysicalRangeJoin::GlobalSortedTable>,_true>
             ::operator->((unique_ptr<duckdb::PhysicalRangeJoin::GlobalSortedTable,_std::default_delete<duckdb::PhysicalRangeJoin::GlobalSortedTable>,_true>
                           *)(pGVar7 + 1));
    if ((pGVar8->global_sort_state).sorted_blocks.
        super_vector<duckdb::unique_ptr<duckdb::SortedBlock,_std::default_delete<duckdb::SortedBlock>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::SortedBlock,_std::default_delete<duckdb::SortedBlock>,_true>_>_>
        .
        super__Vector_base<duckdb::unique_ptr<duckdb::SortedBlock,_std::default_delete<duckdb::SortedBlock>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::SortedBlock,_std::default_delete<duckdb::SortedBlock>,_true>_>_>
        ._M_impl.super__Vector_impl_data._M_start ==
        (pGVar8->global_sort_state).sorted_blocks.
        super_vector<duckdb::unique_ptr<duckdb::SortedBlock,_std::default_delete<duckdb::SortedBlock>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::SortedBlock,_std::default_delete<duckdb::SortedBlock>,_true>_>_>
        .
        super__Vector_base<duckdb::unique_ptr<duckdb::SortedBlock,_std::default_delete<duckdb::SortedBlock>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::SortedBlock,_std::default_delete<duckdb::SortedBlock>,_true>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      bVar16 = true;
      goto LAB_00bcb7b3;
    }
    this_02 = vector<duckdb::unique_ptr<duckdb::SortedBlock,_std::default_delete<duckdb::SortedBlock>,_true>,_true>
              ::operator[](&(pGVar8->global_sort_state).sorted_blocks,0);
    pSVar11 = unique_ptr<duckdb::SortedBlock,_std::default_delete<duckdb::SortedBlock>,_true>::
              operator->(this_02);
    sorted_data = unique_ptr<duckdb::SortedData,_std::default_delete<duckdb::SortedData>,_true>::
                  operator*(&pSVar11->payload_data);
    this_03 = (PayloadScanner *)operator_new(0x18);
    PayloadScanner::PayloadScanner(this_03,sorted_data,&pGVar8->global_sort_state,true);
    __ptr = *(PayloadScanner **)this_00;
    *(PayloadScanner **)this_00 = this_03;
    if (__ptr != (PayloadScanner *)0x0) {
      ::std::default_delete<duckdb::PayloadScanner>::operator()(this_00,__ptr);
    }
  }
  pGVar8 = unique_ptr<duckdb::PhysicalRangeJoin::GlobalSortedTable,_std::default_delete<duckdb::PhysicalRangeJoin::GlobalSortedTable>,_true>
           ::operator->((unique_ptr<duckdb::PhysicalRangeJoin::GlobalSortedTable,_std::default_delete<duckdb::PhysicalRangeJoin::GlobalSortedTable>,_true>
                         *)(pGVar7 + 1));
  _Var2._M_head_impl =
       (pGVar8->found_match).super_unique_ptr<bool[],_std::default_delete<bool[]>_>._M_t.
       super___uniq_ptr_impl<bool,_std::default_delete<bool[]>_>._M_t.
       super__Tuple_impl<0UL,_bool_*,_std::default_delete<bool[]>_>.
       super__Head_base<0UL,_bool_*,_false>._M_head_impl;
  DataChunk::DataChunk(&local_70);
  allocator = Allocator::Get(context->client);
  pGVar8 = unique_ptr<duckdb::PhysicalRangeJoin::GlobalSortedTable,_std::default_delete<duckdb::PhysicalRangeJoin::GlobalSortedTable>,_true>
           ::operator->((unique_ptr<duckdb::PhysicalRangeJoin::GlobalSortedTable,_std::default_delete<duckdb::PhysicalRangeJoin::GlobalSortedTable>,_true>
                         *)(pGVar7 + 1));
  DataChunk::Initialize(&local_70,allocator,&(pGVar8->global_sort_state).payload_layout.types,0x800)
  ;
  SelectionVector::SelectionVector(&local_88,0x800);
  do {
    this_01 = unique_ptr<duckdb::PayloadScanner,_std::default_delete<duckdb::PayloadScanner>,_true>
              ::operator->((unique_ptr<duckdb::PayloadScanner,_std::default_delete<duckdb::PayloadScanner>,_true>
                            *)this_00);
    PayloadScanner::Scan(this_01,&local_70);
    if (local_70.count == 0) {
      bVar16 = result->count == 0;
      goto LAB_00bcb79a;
    }
    pIVar3 = pGVar1[1].super_StateWithBlockableTasks.blocked_tasks.
             super_vector<duckdb::InterruptState,_std::allocator<duckdb::InterruptState>_>.
             super__Vector_base<duckdb::InterruptState,_std::allocator<duckdb::InterruptState>_>.
             _M_impl.super__Vector_impl_data._M_start;
    iVar13 = 0;
    count = 0;
    do {
      if ((_Var2._M_head_impl + (long)pIVar3)[iVar13] == false) {
        local_88.sel_vector[count] = (sel_t)iVar13;
        count = count + 1;
      }
      iVar13 = iVar13 + 1;
    } while (local_70.count != iVar13);
    pGVar1[1].super_StateWithBlockableTasks.blocked_tasks.
    super_vector<duckdb::InterruptState,_std::allocator<duckdb::InterruptState>_>.
    super__Vector_base<duckdb::InterruptState,_std::allocator<duckdb::InterruptState>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)((long)&pIVar3->mode + local_70.count);
  } while (count == 0);
  this_04 = &(this->super_PhysicalRangeJoin).super_PhysicalComparisonJoin.super_PhysicalJoin.
             super_CachingPhysicalOperator.super_PhysicalOperator.children;
  pvVar9 = vector<std::reference_wrapper<duckdb::PhysicalOperator>,_true>::operator[](this_04,0);
  pLVar4 = (pvVar9->_M_data->types).
           super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
           super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
           super__Vector_impl_data._M_finish;
  pLVar5 = (pvVar9->_M_data->types).
           super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
           super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
           super__Vector_impl_data._M_start;
  lVar15 = ((long)pLVar4 - (long)pLVar5 >> 3) * -0x5555555555555555;
  if (pLVar4 != pLVar5) {
    sVar12 = 0;
    do {
      pvVar10 = vector<duckdb::Vector,_true>::operator[](&result->data,sVar12);
      Vector::SetVectorType(pvVar10,CONSTANT_VECTOR);
      pvVar10 = vector<duckdb::Vector,_true>::operator[](&result->data,sVar12);
      ConstantVector::SetNull(pvVar10,true);
      sVar12 = sVar12 + 1;
    } while (lVar15 + (ulong)(lVar15 == 0) != sVar12);
  }
  pvVar9 = vector<std::reference_wrapper<duckdb::PhysicalOperator>,_true>::operator[](this_04,1);
  lVar14 = (long)(pvVar9->_M_data->types).
                 super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                 super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                 _M_impl.super__Vector_impl_data._M_finish -
           (long)(pvVar9->_M_data->types).
                 super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                 super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                 _M_impl.super__Vector_impl_data._M_start;
  if (lVar14 != 0) {
    lVar14 = (lVar14 >> 3) * -0x5555555555555555;
    sVar12 = 0;
    do {
      pvVar10 = vector<duckdb::Vector,_true>::operator[](&result->data,lVar15 + sVar12);
      other = vector<duckdb::Vector,_true>::operator[](&local_70.data,sVar12);
      Vector::Slice(pvVar10,other,&local_88,count);
      sVar12 = sVar12 + 1;
    } while (lVar14 + (ulong)(lVar14 == 0) != sVar12);
  }
  result->count = count;
  bVar16 = false;
LAB_00bcb79a:
  if (local_88.selection_data.internal.
      super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_88.selection_data.internal.
               super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  DataChunk::~DataChunk(&local_70);
LAB_00bcb7b3:
  pthread_mutex_unlock((pthread_mutex_t *)(pGVar1 + 1));
  return bVar16;
}

Assistant:

SourceResultType PhysicalPiecewiseMergeJoin::GetData(ExecutionContext &context, DataChunk &result,
                                                     OperatorSourceInput &input) const {
	D_ASSERT(PropagatesBuildSide(join_type));
	// check if we need to scan any unmatched tuples from the RHS for the full/right outer join
	auto &sink = sink_state->Cast<MergeJoinGlobalState>();
	auto &state = input.global_state.Cast<PiecewiseJoinScanState>();

	lock_guard<mutex> l(state.lock);
	if (!state.scanner) {
		// Initialize scanner (if not yet initialized)
		auto &sort_state = sink.table->global_sort_state;
		if (sort_state.sorted_blocks.empty()) {
			return SourceResultType::FINISHED;
		}
		state.scanner = make_uniq<PayloadScanner>(*sort_state.sorted_blocks[0]->payload_data, sort_state);
	}

	// if the LHS is exhausted in a FULL/RIGHT OUTER JOIN, we scan the found_match for any chunks we
	// still need to output
	const auto found_match = sink.table->found_match.get();

	DataChunk rhs_chunk;
	rhs_chunk.Initialize(Allocator::Get(context.client), sink.table->global_sort_state.payload_layout.GetTypes());
	SelectionVector rsel(STANDARD_VECTOR_SIZE);
	for (;;) {
		// Read the next sorted chunk
		state.scanner->Scan(rhs_chunk);

		const auto count = rhs_chunk.size();
		if (count == 0) {
			return result.size() == 0 ? SourceResultType::FINISHED : SourceResultType::HAVE_MORE_OUTPUT;
		}

		idx_t result_count = 0;
		// figure out which tuples didn't find a match in the RHS
		for (idx_t i = 0; i < count; i++) {
			if (!found_match[state.right_outer_position + i]) {
				rsel.set_index(result_count++, i);
			}
		}
		state.right_outer_position += count;

		if (result_count > 0) {
			// if there were any tuples that didn't find a match, output them
			const idx_t left_column_count = children[0].get().GetTypes().size();
			for (idx_t col_idx = 0; col_idx < left_column_count; ++col_idx) {
				result.data[col_idx].SetVectorType(VectorType::CONSTANT_VECTOR);
				ConstantVector::SetNull(result.data[col_idx], true);
			}
			const idx_t right_column_count = children[1].get().GetTypes().size();
			for (idx_t col_idx = 0; col_idx < right_column_count; ++col_idx) {
				result.data[left_column_count + col_idx].Slice(rhs_chunk.data[col_idx], rsel, result_count);
			}
			result.SetCardinality(result_count);
			break;
		}
	}

	return result.size() == 0 ? SourceResultType::FINISHED : SourceResultType::HAVE_MORE_OUTPUT;
}